

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::ObjectIntersectorK<4,_false>_>,_false>
     ::intersect(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,RayQueryContext *context)

{
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar1;
  NodeRef *pNVar2;
  undefined4 uVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  undefined8 uVar8;
  byte bVar9;
  size_t sVar10;
  _func_int **pp_Var11;
  size_t i_1;
  long lVar12;
  size_t sVar13;
  size_t sVar14;
  NodeRef *pNVar15;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar16;
  size_t sVar17;
  byte bVar18;
  ushort uVar19;
  ulong uVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar29;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar30;
  undefined1 auVar31 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar32 [64];
  vint4 ai_2;
  undefined1 auVar33 [16];
  vint4 ai;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar34;
  vint4 ai_1;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  vint4 ai_3;
  undefined1 auVar37 [16];
  vint4 bi;
  undefined1 auVar38 [16];
  vint4 bi_1;
  undefined1 auVar39 [16];
  vint4 bi_3;
  undefined1 auVar40 [16];
  vint4 bi_2;
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  vint4 bi_8;
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  RTCIntersectFunctionNArguments local_35b0;
  Geometry *local_3580;
  undefined8 local_3578;
  RTCIntersectArguments *local_3570;
  undefined1 local_3568 [16];
  undefined1 local_3558 [16];
  undefined1 local_3548 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_3538;
  undefined1 local_3528 [16];
  undefined1 local_3518 [16];
  undefined1 local_3508 [16];
  undefined1 local_34f8 [16];
  vint<4> mask;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  undefined1 auVar28 [16];
  
  stack_node[1].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      intersectCoherent(valid_i,This,ray,context);
      return;
    }
    auVar25 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    uVar20 = vpcmpeqd_avx512vl(auVar25,(undefined1  [16])valid_i->field_0);
    uVar20 = uVar20 & 0xf;
    bVar18 = (byte)uVar20;
    if (bVar18 != 0) {
      auVar25 = *(undefined1 (*) [16])(ray + 0x40);
      auVar28 = *(undefined1 (*) [16])(ray + 0x50);
      auVar33 = *(undefined1 (*) [16])(ray + 0x60);
      auVar22._8_4_ = 0x7fffffff;
      auVar22._0_8_ = 0x7fffffff7fffffff;
      auVar22._12_4_ = 0x7fffffff;
      auVar23 = vandps_avx(auVar25,auVar22);
      auVar27._8_4_ = 0x219392ef;
      auVar27._0_8_ = 0x219392ef219392ef;
      auVar27._12_4_ = 0x219392ef;
      uVar21 = vcmpps_avx512vl(auVar23,auVar27,1);
      bVar5 = (bool)((byte)uVar21 & 1);
      auVar23._0_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar25._0_4_;
      bVar5 = (bool)((byte)(uVar21 >> 1) & 1);
      auVar23._4_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar25._4_4_;
      bVar5 = (bool)((byte)(uVar21 >> 2) & 1);
      auVar23._8_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar25._8_4_;
      bVar5 = (bool)((byte)(uVar21 >> 3) & 1);
      auVar23._12_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar25._12_4_;
      auVar25 = vandps_avx(auVar28,auVar22);
      uVar21 = vcmpps_avx512vl(auVar25,auVar27,1);
      bVar5 = (bool)((byte)uVar21 & 1);
      auVar24._0_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar28._0_4_;
      bVar5 = (bool)((byte)(uVar21 >> 1) & 1);
      auVar24._4_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar28._4_4_;
      bVar5 = (bool)((byte)(uVar21 >> 2) & 1);
      auVar24._8_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar28._8_4_;
      bVar5 = (bool)((byte)(uVar21 >> 3) & 1);
      auVar24._12_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar28._12_4_;
      auVar25 = vandps_avx(auVar33,auVar22);
      uVar21 = vcmpps_avx512vl(auVar25,auVar27,1);
      bVar5 = (bool)((byte)uVar21 & 1);
      auVar26._0_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar33._0_4_;
      bVar5 = (bool)((byte)(uVar21 >> 1) & 1);
      auVar26._4_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar33._4_4_;
      bVar5 = (bool)((byte)(uVar21 >> 2) & 1);
      auVar26._8_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar33._8_4_;
      bVar5 = (bool)((byte)(uVar21 >> 3) & 1);
      auVar26._12_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar33._12_4_;
      auVar22 = vrcp14ps_avx512vl(auVar23);
      auVar35._8_4_ = 0x3f800000;
      auVar35._0_8_ = 0x3f8000003f800000;
      auVar35._12_4_ = 0x3f800000;
      auVar25 = vfnmadd213ps_fma(auVar23,auVar22,auVar35);
      auVar23 = vrcp14ps_avx512vl(auVar24);
      auVar28 = vfnmadd213ps_fma(auVar24,auVar23,auVar35);
      auVar24 = vrcp14ps_avx512vl(auVar26);
      auVar33 = vfnmadd213ps_fma(auVar26,auVar24,auVar35);
      local_3508 = vfmadd132ps_fma(auVar25,auVar22,auVar22);
      auVar41 = ZEXT1664(local_3508);
      local_3518 = vfmadd132ps_fma(auVar28,auVar23,auVar23);
      auVar42 = ZEXT1664(local_3518);
      local_3528 = vfmadd132ps_fma(auVar33,auVar24,auVar24);
      auVar43 = ZEXT1664(local_3528);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar44 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar25 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),ZEXT816(0) << 0x20);
      local_3538._0_4_ = (uint)(bVar18 & 1) * auVar25._0_4_ | (uint)!(bool)(bVar18 & 1) * 0x7f800000
      ;
      bVar5 = (bool)((byte)(uVar20 >> 1) & 1);
      local_3538._4_4_ = (uint)bVar5 * auVar25._4_4_ | (uint)!bVar5 * 0x7f800000;
      bVar5 = (bool)((byte)(uVar20 >> 2) & 1);
      local_3538._8_4_ = (uint)bVar5 * auVar25._8_4_ | (uint)!bVar5 * 0x7f800000;
      bVar5 = SUB81(uVar20 >> 3,0);
      local_3538._12_4_ = (uint)bVar5 * auVar25._12_4_ | (uint)!bVar5 * 0x7f800000;
      auVar45 = ZEXT1664((undefined1  [16])local_3538);
      auVar25 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),ZEXT816(0) << 0x20);
      bVar5 = (bool)((byte)(uVar20 >> 1) & 1);
      bVar6 = (bool)((byte)(uVar20 >> 2) & 1);
      bVar7 = SUB81(uVar20 >> 3,0);
      auVar46 = ZEXT1664(CONCAT412((uint)bVar7 * auVar25._12_4_ | (uint)!bVar7 * -0x800000,
                                   CONCAT48((uint)bVar6 * auVar25._8_4_ | (uint)!bVar6 * -0x800000,
                                            CONCAT44((uint)bVar5 * auVar25._4_4_ |
                                                     (uint)!bVar5 * -0x800000,
                                                     (uint)(bVar18 & 1) * auVar25._0_4_ |
                                                     (uint)!(bool)(bVar18 & 1) * -0x800000))));
      pNVar15 = stack_node + 2;
      paVar16 = &stack_near[2].field_0;
      local_3548._0_4_ = local_3508._0_4_ * -*(float *)ray;
      local_3548._4_4_ = local_3508._4_4_ * -*(float *)(ray + 4);
      local_3548._8_4_ = local_3508._8_4_ * -*(float *)(ray + 8);
      local_3548._12_4_ = local_3508._12_4_ * -*(float *)(ray + 0xc);
      auVar47 = ZEXT1664(local_3548);
      auVar25 = *(undefined1 (*) [16])(ray + 0x10);
      auVar33._0_8_ = auVar25._0_8_ ^ 0x8000000080000000;
      auVar33._8_4_ = auVar25._8_4_ ^ 0x80000000;
      auVar33._12_4_ = auVar25._12_4_ ^ 0x80000000;
      local_3558 = vmulps_avx512vl(local_3518,auVar33);
      auVar48 = ZEXT1664(local_3558);
      auVar25 = *(undefined1 (*) [16])(ray + 0x20);
      auVar28._0_8_ = auVar25._0_8_ ^ 0x8000000080000000;
      auVar28._8_4_ = auVar25._8_4_ ^ 0x80000000;
      auVar28._12_4_ = auVar25._12_4_ ^ 0x80000000;
      local_3568 = vmulps_avx512vl(local_3528,auVar28);
      auVar49 = ZEXT1664(local_3568);
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[1].field_0 = local_3538;
LAB_01d83e0f:
      pNVar2 = pNVar15 + -1;
      if (pNVar2->ptr != 0xfffffffffffffff8) {
        pNVar15 = pNVar15 + -1;
        paVar1 = paVar16 + -1;
        auVar32 = ZEXT1664((undefined1  [16])*paVar1);
        paVar16 = paVar16 + -1;
        local_34f8 = auVar46._0_16_;
        uVar8 = vcmpps_avx512vl((undefined1  [16])*paVar1,local_34f8,1);
        sVar17 = pNVar2->ptr;
        if ((char)uVar8 != '\0') {
          while ((sVar17 & 8) == 0) {
            auVar32 = ZEXT1664(auVar44._0_16_);
            uVar20 = 0;
            sVar10 = 8;
            for (lVar12 = 0;
                (lVar12 != 8 &&
                (sVar14 = *(size_t *)((sVar17 & 0xfffffffffffffff0) + lVar12 * 8), sVar14 != 8));
                lVar12 = lVar12 + 1) {
              uVar3 = *(undefined4 *)(sVar17 + 0x40 + lVar12 * 4);
              auVar25._4_4_ = uVar3;
              auVar25._0_4_ = uVar3;
              auVar25._8_4_ = uVar3;
              auVar25._12_4_ = uVar3;
              auVar33 = vfmadd132ps_fma(auVar25,auVar47._0_16_,auVar41._0_16_);
              uVar3 = *(undefined4 *)(sVar17 + 0x80 + lVar12 * 4);
              auVar36._4_4_ = uVar3;
              auVar36._0_4_ = uVar3;
              auVar36._8_4_ = uVar3;
              auVar36._12_4_ = uVar3;
              auVar24 = vfmadd132ps_avx512vl(auVar36,auVar48._0_16_,auVar42._0_16_);
              uVar3 = *(undefined4 *)(sVar17 + 0xc0 + lVar12 * 4);
              auVar37._4_4_ = uVar3;
              auVar37._0_4_ = uVar3;
              auVar37._8_4_ = uVar3;
              auVar37._12_4_ = uVar3;
              auVar26 = vfmadd132ps_avx512vl(auVar37,auVar49._0_16_,auVar43._0_16_);
              uVar3 = *(undefined4 *)(sVar17 + 0x60 + lVar12 * 4);
              auVar38._4_4_ = uVar3;
              auVar38._0_4_ = uVar3;
              auVar38._8_4_ = uVar3;
              auVar38._12_4_ = uVar3;
              auVar23 = vfmadd132ps_fma(auVar38,auVar47._0_16_,auVar41._0_16_);
              uVar3 = *(undefined4 *)(sVar17 + 0xa0 + lVar12 * 4);
              auVar39._4_4_ = uVar3;
              auVar39._0_4_ = uVar3;
              auVar39._8_4_ = uVar3;
              auVar39._12_4_ = uVar3;
              auVar22 = vfmadd132ps_avx512vl(auVar39,auVar48._0_16_,auVar42._0_16_);
              uVar3 = *(undefined4 *)(sVar17 + 0xe0 + lVar12 * 4);
              auVar40._4_4_ = uVar3;
              auVar40._0_4_ = uVar3;
              auVar40._8_4_ = uVar3;
              auVar40._12_4_ = uVar3;
              auVar27 = vfmadd132ps_avx512vl(auVar40,auVar49._0_16_,auVar43._0_16_);
              auVar25 = vpminsd_avx(auVar33,auVar23);
              auVar28 = vpminsd_avx(auVar24,auVar22);
              auVar25 = vpmaxsd_avx(auVar25,auVar28);
              auVar28 = vpminsd_avx(auVar26,auVar27);
              auVar25 = vpmaxsd_avx(auVar25,auVar28);
              auVar28 = vpmaxsd_avx(auVar33,auVar23);
              auVar33 = vpmaxsd_avx(auVar24,auVar22);
              auVar23 = vpminsd_avx(auVar28,auVar33);
              auVar28 = vpmaxsd_avx(auVar26,auVar27);
              auVar33 = vpmaxsd_avx(auVar25,auVar45._0_16_);
              auVar28 = vpminsd_avx(auVar28,local_34f8);
              auVar28 = vpminsd_avx(auVar23,auVar28);
              uVar21 = vpcmpd_avx512vl(auVar33,auVar28,2);
              uVar21 = uVar21 & 0xf;
              if ((byte)uVar21 != 0) {
                auVar28 = vblendmps_avx512vl(auVar44._0_16_,auVar25);
                bVar5 = (bool)((byte)uVar21 & 1);
                aVar29._0_4_ = (uint)bVar5 * auVar28._0_4_ | (uint)!bVar5 * auVar25._0_4_;
                bVar5 = (bool)((byte)(uVar21 >> 1) & 1);
                aVar29._4_4_ = (uint)bVar5 * auVar28._4_4_ | (uint)!bVar5 * auVar25._4_4_;
                bVar5 = (bool)((byte)(uVar21 >> 2) & 1);
                aVar29._8_4_ = (uint)bVar5 * auVar28._8_4_ | (uint)!bVar5 * auVar25._8_4_;
                bVar5 = SUB81(uVar21 >> 3,0);
                aVar29._12_4_ = (uint)bVar5 * auVar28._12_4_ | (uint)!bVar5 * auVar25._12_4_;
                aVar30 = auVar32._0_16_;
                uVar8 = vcmpps_avx512vl((undefined1  [16])aVar29,(undefined1  [16])aVar30,1);
                sVar13 = sVar10;
                aVar34 = aVar29;
                if (((char)uVar8 == '\0') ||
                   (sVar13 = sVar14, sVar14 = sVar10, aVar34 = aVar30, aVar30 = aVar29, sVar10 != 8)
                   ) {
                  aVar29 = aVar30;
                  uVar20 = uVar20 + 1;
                  pNVar15->ptr = sVar14;
                  pNVar15 = pNVar15 + 1;
                  *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar16->v = aVar34;
                  paVar16 = paVar16 + 1;
                }
                sVar10 = sVar13;
                auVar32 = ZEXT1664((undefined1  [16])aVar29);
              }
            }
            if (sVar10 == 8) goto LAB_01d83e0f;
            sVar17 = sVar10;
            if (1 < uVar20) {
              aVar34 = paVar16[-2];
              aVar29 = paVar16[-1];
              uVar8 = vcmpps_avx512vl((undefined1  [16])aVar34,(undefined1  [16])aVar29,1);
              aVar30 = aVar29;
              if ((char)uVar8 != '\0') {
                paVar16[-2] = aVar29;
                paVar16[-1] = aVar34;
                auVar25 = vpermilps_avx(*(undefined1 (*) [16])(pNVar15 + -2),0x4e);
                *(undefined1 (*) [16])(pNVar15 + -2) = auVar25;
                aVar30 = aVar34;
                aVar34 = aVar29;
              }
              if (uVar20 != 2) {
                aVar29 = paVar16[-3];
                uVar8 = vcmpps_avx512vl((undefined1  [16])aVar29,(undefined1  [16])aVar30,1);
                if ((char)uVar8 != '\0') {
                  paVar16[-3] = aVar30;
                  paVar16[-1] = aVar29;
                  sVar10 = pNVar15[-3].ptr;
                  pNVar15[-3].ptr = pNVar15[-1].ptr;
                  pNVar15[-1].ptr = sVar10;
                  aVar29 = aVar30;
                }
                uVar8 = vcmpps_avx512vl((undefined1  [16])aVar29,(undefined1  [16])aVar34,1);
                if ((char)uVar8 != '\0') {
                  paVar16[-3] = aVar34;
                  paVar16[-2] = aVar29;
                  auVar25 = vpermilps_avx(*(undefined1 (*) [16])(pNVar15 + -3),0x4e);
                  *(undefined1 (*) [16])(pNVar15 + -3) = auVar25;
                }
              }
            }
          }
          if (sVar17 == 0xfffffffffffffff8) {
            return;
          }
          uVar8 = vcmpps_avx512vl(local_34f8,auVar32._0_16_,6);
          uVar19 = (ushort)uVar8;
          bVar18 = (byte)uVar8;
          if (bVar18 != 0) {
            for (lVar12 = 0; (ulong)((uint)sVar17 & 0xf) - 8 != lVar12; lVar12 = lVar12 + 1) {
              local_35b0.geomID = *(uint *)((sVar17 & 0xfffffffffffffff0) + lVar12 * 8);
              local_3580 = (context->scene->geometries).items[local_35b0.geomID].ptr;
              uVar4 = local_3580->mask;
              auVar31._4_4_ = uVar4;
              auVar31._0_4_ = uVar4;
              auVar31._8_4_ = uVar4;
              auVar31._12_4_ = uVar4;
              uVar8 = vptestmd_avx512vl(auVar31,*(undefined1 (*) [16])(ray + 0x90));
              bVar9 = (byte)uVar8 & 0xf & bVar18;
              if (bVar9 != 0) {
                local_35b0.primID = *(uint *)((sVar17 & 0xfffffffffffffff0) + 4 + lVar12 * 8);
                mask.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                               vpmovm2d_avx512vl((ulong)bVar9);
                local_35b0.valid = (int *)&mask;
                local_35b0.geometryUserPtr = local_3580->userPtr;
                local_35b0.context = context->user;
                local_35b0.N = 4;
                local_3578 = 0;
                local_3570 = context->args;
                pp_Var11 = (_func_int **)local_3570->intersect;
                if (pp_Var11 == (_func_int **)0x0) {
                  pp_Var11 = local_3580[1].super_RefCount._vptr_RefCount;
                }
                local_35b0.rayhit = (RTCRayHitN *)ray;
                (*(code *)pp_Var11)(&local_35b0);
                auVar41 = ZEXT1664(local_3508);
                auVar42 = ZEXT1664(local_3518);
                auVar43 = ZEXT1664(local_3528);
                auVar44 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                auVar45 = ZEXT1664((undefined1  [16])local_3538);
                auVar46 = ZEXT1664(local_34f8);
                auVar47 = ZEXT1664(local_3548);
                auVar48 = ZEXT1664(local_3558);
                auVar49 = ZEXT1664(local_3568);
              }
            }
            bVar5 = (bool)((byte)(uVar19 >> 1) & 1);
            bVar6 = (bool)((byte)(uVar19 >> 2) & 1);
            bVar7 = (bool)((byte)(uVar19 >> 3) & 1);
            auVar46 = ZEXT1664(CONCAT412((uint)bVar7 * *(int *)(ray + 0x8c) |
                                         (uint)!bVar7 * auVar46._12_4_,
                                         CONCAT48((uint)bVar6 * *(int *)(ray + 0x88) |
                                                  (uint)!bVar6 * auVar46._8_4_,
                                                  CONCAT44((uint)bVar5 * *(int *)(ray + 0x84) |
                                                           (uint)!bVar5 * auVar46._4_4_,
                                                           (uint)(bVar18 & 1) * *(int *)(ray + 0x80)
                                                           | (uint)!(bool)(bVar18 & 1) *
                                                             auVar46._0_4_))));
          }
        }
        goto LAB_01d83e0f;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }